

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

_variable_type __thiscall
gl4cts::FunctionObject::unaryWithOutputByComponent<double,_double,_int>::getResultType
          (unaryWithOutputByComponent<double,_double,_int> *this,GLuint result)

{
  long lVar1;
  TestError *this_00;
  
  lVar1 = 0x20;
  if (result != 0) {
    if (result != 1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x307f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar1 = 0x28;
  }
  return *(_variable_type *)
          ((long)&(this->super_unaryBase).super_functionObject._vptr_functionObject + lVar1);
}

Assistant:

Utils::_variable_type getResultType(glw::GLuint result) const
	{
		Utils::_variable_type type = Utils::VARIABLE_TYPE_UNKNOWN;

		switch (result)
		{
		case 0:
			type = m_res_type;
			break;
		case 1:
			type = m_out_type;
			break;
		default:
			TCU_FAIL("Not implemented");
			break;
		}

		return type;
	}